

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReaderPrivate::resolvePublicNamespaces(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  long lVar2;
  Tag *pTVar3;
  qsizetype qVar4;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *in_RDI;
  long in_FS_OFFSET;
  QXmlStreamNamespaceDeclaration *publicNamespaceDeclaration;
  NamespaceDeclaration *namespaceDeclaration;
  qsizetype i;
  qsizetype n;
  Tag *tag;
  QXmlString *in_stack_ffffffffffffff88;
  qsizetype in_stack_ffffffffffffff98;
  QList<QXmlStreamNamespaceDeclaration> *in_stack_ffffffffffffffa0;
  long local_58;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pTVar3 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag>::top
                     ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag> *)(in_RDI + 3));
  qVar4 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::size(in_RDI);
  lVar2 = pTVar3->namespaceDeclarationsSize;
  QList<QXmlStreamNamespaceDeclaration>::resize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
  ;
  for (local_58 = 0; local_58 < qVar4 - lVar2; local_58 = local_58 + 1) {
    QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::at
              (in_RDI,pTVar3->namespaceDeclarationsSize + local_58);
    QList<QXmlStreamNamespaceDeclaration>::operator[]
              ((QList<QXmlStreamNamespaceDeclaration> *)in_RDI,(qsizetype)in_stack_ffffffffffffff88)
    ;
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString((XmlStringRef *)this_00);
    QtPrivate::QXmlString::operator=((QXmlString *)in_RDI,in_stack_ffffffffffffff88);
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x649797);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString((XmlStringRef *)this_00);
    QtPrivate::QXmlString::operator=((QXmlString *)in_RDI,in_stack_ffffffffffffff88);
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x6497c7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::resolvePublicNamespaces()
{
    const Tag &tag = tagStack.top();
    qsizetype n = namespaceDeclarations.size() - tag.namespaceDeclarationsSize;
    publicNamespaceDeclarations.resize(n);
    for (qsizetype i = 0; i < n; ++i) {
        const NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.at(tag.namespaceDeclarationsSize + i);
        QXmlStreamNamespaceDeclaration &publicNamespaceDeclaration = publicNamespaceDeclarations[i];
        publicNamespaceDeclaration.m_prefix = namespaceDeclaration.prefix;
        publicNamespaceDeclaration.m_namespaceUri = namespaceDeclaration.namespaceUri;
    }
}